

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O0

void do_gc(void)

{
  int64_t iVar1;
  object *poVar2;
  int64_t iVar3;
  int64_t end;
  int64_t start;
  int i;
  
  iVar1 = time_usec();
  if (inSpaceOne == 0) {
    memoryBase = spaceOne;
    oldBase = spaceTwo;
  }
  else {
    memoryBase = spaceTwo;
    oldBase = spaceOne;
  }
  inSpaceOne = (int)(inSpaceOne == 0);
  memoryPointer = memoryBase + spaceSize;
  oldTop = oldBase + spaceSize;
  memoryTop = memoryPointer;
  for (start._4_4_ = 0; start._4_4_ < rootTop; start._4_4_ = start._4_4_ + 1) {
    poVar2 = gc_move((mobject *)rootStack[start._4_4_]);
    rootStack[start._4_4_] = poVar2;
  }
  for (start._4_4_ = 0; start._4_4_ < staticRootTop; start._4_4_ = start._4_4_ + 1) {
    poVar2 = gc_move((mobject *)*staticRoots[start._4_4_]);
    *staticRoots[start._4_4_] = poVar2;
  }
  flushCache();
  gc_total_mem_copied = (long)memoryTop + (gc_total_mem_copied - (long)memoryPointer);
  if (gc_mem_max_copied < (long)memoryTop - (long)memoryPointer) {
    gc_mem_max_copied = (long)memoryTop - (long)memoryPointer;
  }
  iVar3 = time_usec();
  gc_count = gc_count + 1;
  gc_total_time = (iVar3 - iVar1) + gc_total_time;
  if (gc_max_time < iVar3 - iVar1) {
    gc_max_time = iVar3 - iVar1;
  }
  return;
}

Assistant:

void do_gc()
{
    int i;
    int64_t start = time_usec();
    int64_t end = 0;

    /* first change spaces */
    if (inSpaceOne) {
        memoryBase = spaceTwo;
        inSpaceOne = 0;
        oldBase = spaceOne;
    } else {
        memoryBase = spaceOne;
        inSpaceOne = 1;
        oldBase = spaceTwo;
    }

    memoryPointer = memoryTop = memoryBase + spaceSize;
    oldTop = oldBase + spaceSize;

    /* then do the collection */
    for (i = 0; i < rootTop; i++) {
        rootStack[i] = gc_move((struct mobject *) rootStack[i]);
    }
    for (i = 0; i < staticRootTop; i++) {
        (* staticRoots[i]) =  gc_move((struct mobject *)
                                      *staticRoots[i]);
    }

    flushCache();

    /* FIXME - pointer comparisons are NOT portable. */
    gc_total_mem_copied += ((char *)memoryTop - (char *)memoryPointer);
    if(((char *)memoryTop - (char *)memoryPointer) > gc_mem_max_copied) {
        gc_mem_max_copied = ((char *)memoryTop - (char *)memoryPointer);
    }

    end = time_usec();

    /* calculate stats about the GC runs. */
    gc_count++;
    gc_total_time += (end - start);

    if(gc_max_time < (end - start)) {
        gc_max_time = (end - start);
    }
}